

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

void __thiscall pbrt::Tensor::Tensor(Tensor *this,string *filename)

{
  string *this_00;
  uint8_t uVar1;
  uint64_t uVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  size_t sVar5;
  long __off;
  mapped_type *this_01;
  char *pcVar6;
  ulong uVar7;
  ulong __n;
  ulong uVar8;
  ulong uVar9;
  uint8_t dtype;
  string *local_f8;
  uint8_t version [2];
  uint16_t ndim;
  uint16_t name_length;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> data;
  uint32_t n_fields;
  ulong local_c0;
  ulong local_b8;
  uint64_t offset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  string name;
  uint8_t header [12];
  uint64_t size_value;
  uint64_t local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_38;
  
  this_00 = &this->m_filename;
  (this->m_fields)._M_h._M_buckets = &(this->m_fields)._M_h._M_single_bucket;
  (this->m_fields)._M_h._M_bucket_count = 1;
  (this->m_fields)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_fields)._M_h._M_element_count = 0;
  (this->m_fields)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_fields)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_fields)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)this_00,(string *)filename);
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar6 = "%s: unable to open file";
  }
  else {
    iVar3 = fseek(__stream,0,2);
    if (iVar3 == 0) {
      sVar4 = ftell(__stream);
      if (sVar4 == 0xffffffffffffffff) {
        pcVar6 = "%s: Tensor: Unable to tell file cursor position.";
      }
      else {
        this->m_size = sVar4;
        rewind(__stream);
        if (0x11 < this->m_size) {
          sVar5 = fread(header,1,0xc,__stream);
          local_f8 = this_00;
          if (sVar5 == 0xc) {
            sVar5 = fread(version,1,2,__stream);
            if (sVar5 == 2) {
              sVar5 = fread(&n_fields,4,1,__stream);
              if (sVar5 == 1) {
                iVar3 = bcmp(header,"tensor_file",0xc);
                if (iVar3 == 0) {
                  pcVar6 = "%s: Tensor: Invalid tensor file: unknown file version.";
                  if ((version[0] == '\x01') && (version[1] == '\0')) {
                    uVar8 = 0;
                    while( true ) {
                      if ((uint32_t)uVar8 == n_fields) {
                        fclose(__stream);
                        return;
                      }
                      sVar5 = fread(&name_length,2,1,__stream);
                      if (sVar5 != 1) {
                        fclose(__stream);
                        ErrorExit<std::__cxx11::string_const&>
                                  ("%s: Tensor: Unable to read &name_length.",filename);
                      }
                      uVar7 = (ulong)name_length;
                      name._M_dataplus._M_p = (pointer)&name.field_2;
                      std::__cxx11::string::_M_construct((ulong)&name,(char)name_length);
                      sVar5 = fread(name._M_dataplus._M_p,1,uVar7,__stream);
                      if (sVar5 != uVar7) break;
                      sVar5 = fread(&ndim,2,1,__stream);
                      if (sVar5 != 1) {
                        pcVar6 = "%s: Tensor: Unable to read &ndim.";
                        goto LAB_00371fa5;
                      }
                      sVar5 = fread(&dtype,1,1,__stream);
                      if (sVar5 != 1) {
                        pcVar6 = "%s: Tensor: Unable to read &dtype.";
                        goto LAB_00371fa5;
                      }
                      sVar5 = fread(&offset,8,1,__stream);
                      uVar1 = dtype;
                      if (sVar5 != 1) {
                        pcVar6 = "%s: Tensor: Unable to read &offset.";
                        goto LAB_00371fa5;
                      }
                      uVar7 = (ulong)dtype;
                      if (10 < (byte)(dtype - 1)) {
                        pcVar6 = "%s: Tensor: Invalid tensor file: unknown type.";
                        goto LAB_00371fa5;
                      }
                      __n = (ulong)ndim;
                      local_b8 = uVar8;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                (&shape,__n,(allocator_type *)&size_value);
                      uVar8 = *(ulong *)("N4pbrt13ConductorBxDFE" + (long)(char)uVar1 * 8 + 0x15);
                      local_c0 = uVar7;
                      for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
                        sVar5 = fread((Field *)&size_value,8,1,__stream);
                        if (sVar5 != 1) {
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>
                                    ("%s: Tensor: Unable to read &size_value.",filename);
                        }
                        shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9] =
                             CONCAT44(size_value._4_4_,(undefined4)size_value);
                        uVar8 = uVar8 * CONCAT44(size_value._4_4_,(undefined4)size_value);
                      }
                      data._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                            )operator_new__(uVar8);
                      __off = ftell(__stream);
                      uVar2 = offset;
                      if (__off == -1) {
                        pcVar6 = "%s: Tensor: Unable to tell current cursor position.";
LAB_00371fda:
                        fclose(__stream);
                        ErrorExit<std::__cxx11::string_const&>(pcVar6,filename);
                      }
                      iVar3 = fseek(__stream,offset,0);
                      if (iVar3 == -1) {
                        pcVar6 = "%s: Tensor: Unable to seek to tensor offset.";
                        goto LAB_00371fda;
                      }
                      sVar5 = fread((void *)data._M_t.
                                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                            .super__Head_base<0UL,_unsigned_char_*,_false>.
                                            _M_head_impl,1,uVar8,__stream);
                      if (sVar5 != uVar8) {
                        pcVar6 = "%s: Tensor: Unable to read data.get().";
                        goto LAB_00371fda;
                      }
                      iVar3 = fseek(__stream,__off,0);
                      if (iVar3 == -1) {
                        pcVar6 = "%s: Tensor: Unable to seek back to current position";
                        goto LAB_00371fda;
                      }
                      size_value._0_4_ = (undefined4)local_c0;
                      local_58 = uVar2;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                (&local_50,&shape);
                      uVar8 = local_b8;
                      local_38 = data;
                      data._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                            )(__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                             0x0;
                      this_01 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)this,&name);
                      Field::operator=(this_01,(Field *)&size_value);
                      Field::~Field((Field *)&size_value);
                      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      ~unique_ptr(&data);
                      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                      ~_Vector_base(&shape.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   );
                      std::__cxx11::string::~string((string *)&name);
                      uVar8 = (ulong)((int)uVar8 + 1);
                    }
                    pcVar6 = "%s: Tensor: Unable to read (char *)name.data().";
LAB_00371fa5:
                    fclose(__stream);
                    ErrorExit<std::__cxx11::string_const&>(pcVar6,filename);
                  }
                }
                else {
                  pcVar6 = "%s: Tensor: Invalid tensor file: invalid header.";
                }
              }
              else {
                pcVar6 = "%s: Tensor: Unable to read &n_fields.";
              }
            }
            else {
              pcVar6 = "%s: Tensor: Unable to read version.";
            }
          }
          else {
            pcVar6 = "%s: Tensor: Unable to read header.";
          }
          fclose(__stream);
          ErrorExit<std::__cxx11::string_const&>(pcVar6,filename);
        }
        pcVar6 = "%s: Tensor: Invalid tensor file: too small, truncated?";
      }
      fclose(__stream);
      ErrorExit<std::__cxx11::string_const&>(pcVar6,filename);
    }
    fclose(__stream);
    pcVar6 = "%s: Tensor: Unable to seek to end of file.";
  }
  ErrorExit<std::__cxx11::string_const&>(pcVar6,filename);
}

Assistant:

Tensor::Tensor(const std::string &filename) : m_filename(filename) {
    // Helpful macros to limit error-handling code duplication
#ifdef ASSERT
#undef ASSERT
#endif  // ASSERT

#define ASSERT(cond, msg)                            \
    do {                                             \
        if (!(cond)) {                               \
            fclose(file);                            \
            ErrorExit("%s: Tensor: " msg, filename); \
        }                                            \
    } while (0)

#define SAFE_READ(vars, size, count) \
    ASSERT(fread(vars, size, count, file) == (count), "Unable to read " #vars ".")

    FILE *file = fopen(filename.c_str(), "rb");
    if (file == NULL)
        ErrorExit("%s: unable to open file", filename);

    ASSERT(!fseek(file, 0, SEEK_END), "Unable to seek to end of file.");

    long size = ftell(file);
    ASSERT(size != -1, "Unable to tell file cursor position.");
    m_size = static_cast<size_t>(size);
    rewind(file);

    ASSERT(m_size >= 12 + 2 + 4, "Invalid tensor file: too small, truncated?");

    uint8_t header[12], version[2];
    uint32_t n_fields;
    SAFE_READ(header, sizeof(*header), 12);
    SAFE_READ(version, sizeof(*version), 2);
    SAFE_READ(&n_fields, sizeof(n_fields), 1);

    ASSERT(memcmp(header, "tensor_file", 12) == 0,
           "Invalid tensor file: invalid header.");
    ASSERT(version[0] == 1 && version[1] == 0,
           "Invalid tensor file: unknown file version.");

    for (uint32_t i = 0; i < n_fields; ++i) {
        uint8_t dtype;
        uint16_t name_length, ndim;
        uint64_t offset;

        SAFE_READ(&name_length, sizeof(name_length), 1);
        std::string name(name_length, '\0');
        SAFE_READ((char *)name.data(), 1, name_length);
        SAFE_READ(&ndim, sizeof(ndim), 1);
        SAFE_READ(&dtype, sizeof(dtype), 1);
        SAFE_READ(&offset, sizeof(offset), 1);
        ASSERT(dtype != Invalid && dtype <= Float64,
               "Invalid tensor file: unknown type.");

        std::vector<size_t> shape(ndim);
        size_t total_size = type_size((Type)dtype);  // no need to check here, line 43
                                                     // already removes invalid types
        for (size_t j = 0; j < (size_t)ndim; ++j) {
            uint64_t size_value;
            SAFE_READ(&size_value, sizeof(size_value), 1);
            shape[j] = (size_t)size_value;
            total_size *= shape[j];
        }

        auto data = std::unique_ptr<uint8_t[]>(new uint8_t[total_size]);

        long cur_pos = ftell(file);
        ASSERT(cur_pos != -1, "Unable to tell current cursor position.");
        ASSERT(fseek(file, offset, SEEK_SET) != -1, "Unable to seek to tensor offset.");
        SAFE_READ(data.get(), 1, total_size);
        ASSERT(fseek(file, cur_pos, SEEK_SET) != -1,
               "Unable to seek back to current position");

        m_fields[name] =
            Field{(Type)dtype, static_cast<size_t>(offset), shape, std::move(data)};
    }

    fclose(file);

#undef SAFE_READ
#undef ASSERT
}